

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O2

int parse_ip(char *addr,nng_sockaddr *sa,_Bool want_port)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  char *__s;
  char local_98;
  char local_97 [7];
  char buf [64];
  addrinfo *local_28;
  addrinfo *results;
  
  pcVar4 = "";
  if (addr != (char *)0x0) {
    pcVar4 = addr;
  }
  __s = &local_98;
  snprintf(__s,0x40,"%s",pcVar4);
  if (local_98 == '[') {
    bVar1 = true;
    __s = local_97;
  }
  else {
    pcVar4 = local_97;
    cVar3 = local_98;
    while ((cVar3 != '\0' && (cVar3 != '.'))) {
      if (cVar3 == ':') {
        bVar1 = true;
        goto LAB_0011c358;
      }
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    }
    bVar1 = false;
  }
LAB_0011c358:
  for (pcVar4 = __s; cVar3 = *pcVar4, cVar3 != '\0'; pcVar4 = pcVar4 + 1) {
    if (local_98 == '[') {
      if (cVar3 == ']') {
        *pcVar4 = '\0';
        pcVar4 = pcVar4 + 1;
        goto LAB_0011c39a;
      }
    }
    else if ((bool)(~bVar1 & cVar3 == ':')) goto LAB_0011c39a;
  }
  if (local_98 == '[') {
    return 0xf;
  }
LAB_0011c39a:
  cVar3 = *pcVar4;
  if (want_port) {
    if (cVar3 == ':') {
      *pcVar4 = '\0';
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    }
    if (cVar3 != '\0') goto LAB_0011c3c0;
  }
  else if (cVar3 != '\0') {
    return 0xf;
  }
  pcVar4 = "0";
LAB_0011c3c0:
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  if (bVar1) {
    buf[0x3c] = '\n';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
  }
  buf[0x38] = '%';
  buf[0x39] = '\x04';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  iVar2 = getaddrinfo(__s,pcVar4,(addrinfo *)(buf + 0x38),&local_28);
  if (local_28 == (addrinfo *)0x0 || iVar2 != 0) {
    iVar2 = nni_plat_errno(iVar2);
  }
  else {
    nni_posix_sockaddr2nn(sa,local_28->ai_addr,(ulong)local_28->ai_addrlen);
    freeaddrinfo(local_28);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
parse_ip(const char *addr, nng_sockaddr *sa, bool want_port)
{
	struct addrinfo  hints;
	struct addrinfo *results;
	int              rv;
	char            *port;
	char            *host;
	char             buf[64];

#ifdef NNG_ENABLE_IPV6
	bool  v6      = false;
	bool  wrapped = false;
	char *s;
#endif

	if (addr == NULL) {
		addr = "";
	}

	snprintf(buf, sizeof(buf), "%s", addr);
	host = buf;
#ifdef NNG_ENABLE_IPV6
	if (*host == '[') {
		v6      = true;
		wrapped = true;
		host++;
	} else {
		for (s = host; *s != '\0'; s++) {
			if (*s == '.') {
				break;
			}
			if (*s == ':') {
				v6 = true;
				break;
			}
		}
	}
	for (port = host; *port != '\0'; port++) {
		if (wrapped) {
			if (*port == ']') {
				*port++ = '\0';
				wrapped = false;
				break;
			}
		} else if (!v6) {
			if (*port == ':') {
				break;
			}
		}
	}

	if (wrapped) {
		// Never got the closing bracket.
		rv = NNG_EADDRINVAL;
		goto done;
	}
#else  // NNG_ENABLE_IPV6
	for (port = host; *port != '\0'; port++) {
		if (*port == ':') {
			break;
		}
	}
#endif // NNG_ENABLE_IPV6

	if ((!want_port) && (*port != '\0')) {
		rv = NNG_EADDRINVAL;
		goto done;
	} else if (*port == ':') {
		*port++ = '\0';
	}

	if (*port == '\0') {
		port = "0";
	}

	memset(&hints, 0, sizeof(hints));
	hints.ai_flags = AI_NUMERICSERV | AI_NUMERICHOST | AI_PASSIVE;
#ifdef NNG_ENABLE_IPV6
	if (v6) {
		hints.ai_family = AF_INET6;
	}
#else
	hints.ai_family = AF_INET;
#endif
#ifdef AI_ADDRCONFIG
	hints.ai_flags |= AI_ADDRCONFIG;
#endif

	rv = getaddrinfo(host, port, &hints, &results);
	if ((rv != 0) || (results == NULL)) {
		rv = nni_plat_errno(rv);
		goto done;
	}
	nni_posix_sockaddr2nn(
	    sa, (void *) results->ai_addr, results->ai_addrlen);
	freeaddrinfo(results);

done:
	return (rv);
}